

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O1

TestStatus *
vkt::anon_unknown_0::logPlatformInfo(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  int iVar1;
  undefined4 extraout_var;
  ostringstream details;
  long *local_328;
  long local_320;
  long local_318 [2];
  undefined1 local_308 [16];
  TestLog local_2f8 [13];
  ios_base local_290 [264];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  iVar1 = (*context->m_testCtx->m_platform->_vptr_Platform[5])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
            ((long *)CONCAT44(extraout_var,iVar1),local_188);
  local_308._0_8_ = context->m_testCtx->m_log;
  this = (ostringstream *)(local_308 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)local_328,local_320);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_328 != local_318) {
    operator_delete(local_328,local_318[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_290);
  local_308._0_8_ = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Not validated","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_308._0_8_,
             (long)(qpTestLog **)local_308._0_8_ + local_308._8_8_);
  if ((TestLog *)local_308._0_8_ != local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)((long)&(local_2f8[0].m_log)->flags + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus logPlatformInfo (Context& context)
{
	std::ostringstream details;

	context.getTestContext().getPlatform().getVulkanPlatform().describePlatform(details);

	context.getTestContext().getLog()
		<< TestLog::Message
		<< details.str()
		<< TestLog::EndMessage;

	return tcu::TestStatus::pass("Not validated");
}